

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::Tprint<double>(VM *this)

{
  _Setprecision _Var1;
  ostream *poVar2;
  double_t dVar3;
  double_t value;
  VM *this_local;
  
  dVar3 = POP<double>(this);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
  _Var1 = std::setprecision(6);
  poVar2 = std::operator<<(poVar2,_Var1);
  std::ostream::operator<<(poVar2,dVar3);
  return;
}

Assistant:

void VM::Tprint() {
    auto value = POP<T>();
    if constexpr (std::is_floating_point_v<T>) {
        std::cout << std::fixed << std::setprecision(6) << value;
    }
    else if constexpr (std::is_integral_v<T>) {
        std::cout << value;
    }
}